

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O3

int bloaty::sourcemap::ReadBase64VLQSegment(string_view *data,int32_t (*values) [5])

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  Nonnull<char_*> pcVar4;
  byte bVar5;
  uint uVar6;
  size_t sVar7;
  Arg *pAVar8;
  Arg *a0;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  string_view format;
  string_view format_00;
  string local_68;
  long local_48;
  byte *local_40;
  byte local_38 [32];
  
  sVar7 = data->_M_len;
  a0 = (Arg *)data->_M_str;
  uVar3 = 0;
  while (0 < (long)sVar7) {
    lVar1 = sVar7 - 0x10;
    pcVar2 = a0->scratch_;
    uVar9 = 0;
    bVar5 = 0;
    pAVar8 = a0;
    while( true ) {
      a0 = (Arg *)((long)&(pAVar8->piece_)._M_len + 1);
      sVar7 = sVar7 - 1;
      local_38[0] = (byte)(pAVar8->piece_)._M_len;
      iVar10 = (int)(char)local_38[0];
      if (((byte)(local_38[0] + 0xbf) < 0x1a) || ((byte)(local_38[0] + 0x9f) < 6)) break;
      if ((byte)(local_38[0] + 0x99) < 0x14) {
        uVar11 = iVar10 - 0x67;
      }
      else {
        if ((byte)(local_38[0] - 0x3a) < 0xf5 && local_38[0] != 0x2b) {
          local_40 = local_38;
          local_48 = 1;
          format._M_str = (char *)&local_48;
          format._M_len = (size_t)"Invalid Base64VLQ digit $0";
          absl::Substitute_abi_cxx11_(&local_68,(absl *)0x1a,format,a0);
          Throw(local_68._M_dataplus._M_p,0x50);
        }
        if (local_38[0] < 0x30) {
          uVar11 = local_38[0] == 0x2b ^ 0x1f;
        }
        else {
          uVar11 = iVar10 - 0x1c;
        }
      }
      uVar9 = uVar9 | uVar11 << (bVar5 & 0x1f);
      bVar5 = bVar5 + 5;
      pAVar8 = a0;
      if ((Arg *)(pcVar2 + lVar1) <= a0) goto LAB_0019339c;
    }
    iVar12 = iVar10 + -0x41;
    if (0x60 < local_38[0]) {
      iVar12 = iVar10 + -0x47;
    }
    uVar9 = iVar12 << (bVar5 & 0x1f) | uVar9;
    data->_M_str = (char *)a0;
    data->_M_len = sVar7;
    uVar6 = uVar9 >> 1;
    uVar11 = -uVar6;
    if ((uVar9 & 1) == 0) {
      uVar11 = uVar6;
    }
    (*values)[uVar3] = uVar11;
    if ((sVar7 == 0) ||
       ((bVar5 = (byte)(a0->piece_)._M_len, 0x19 < (byte)((bVar5 & 0xdf) + 0xbf) &&
        (10 < (byte)(bVar5 - 0x2f) && bVar5 != 0x2b)))) {
      if ((uVar3 & 3) != 0 && uVar3 != 3) {
        pcVar4 = absl::numbers_internal::FastIntToBuffer((int)uVar3 + 1,(Nonnull<char_*>)local_38);
        local_48 = (long)pcVar4 - (long)local_38;
        format_00._M_str = (char *)&local_48;
        format_00._M_len = (size_t)"Invalid source map VLQ segment length $0";
        local_40 = local_38;
        absl::Substitute_abi_cxx11_(&local_68,(absl *)0x28,format_00,a0);
        Throw(local_68._M_dataplus._M_p,0x67);
      }
      return (int)uVar3 + 1;
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 5) {
      Throw("Unterminated Base64VLQ segment",0x6c);
    }
  }
LAB_0019339c:
  Throw("Unterminated Base64VLQ",0x5a);
}

Assistant:

static int ReadBase64VLQSegment(std::string_view* data, int32_t (&values)[5]) {
  for (int i = 0; i < 5; i++) {
    values[i] = ReadBase64VLQ(data);
    if (data->empty() || !IsBase64Digit(data->front())) {
      if (i != 0 && i != 3 && i != 4) {
        THROWF("Invalid source map VLQ segment length $0", i + 1);
      }
      return i + 1;
    }
  }
  THROW("Unterminated Base64VLQ segment");
}